

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Wrd_t * Gia_ManSimBitPacking(Gia_Man_t *p,Vec_Int_t *vCexStore,int nCexes,int nUnDecs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Wrd_t *vAddOn;
  Vec_Wrd_t *p_00;
  int *pLits;
  Vec_Wrd_t *pVVar5;
  int Size;
  int Out;
  Vec_Wrd_t *vSimsRes;
  Vec_Wrd_t *vSimsCare;
  Vec_Wrd_t *vSimsIn;
  int nWordsMax;
  int iPat;
  int iCur;
  int c;
  int nUnDecs_local;
  int nCexes_local;
  Vec_Int_t *vCexStore_local;
  Gia_Man_t *p_local;
  
  nWordsMax = 0;
  vSimsIn._4_4_ = 0;
  iVar1 = Abc_Bit6WordNum(nCexes);
  iVar2 = Gia_ManCiNum(p);
  vAddOn = Vec_WrdStartRandom(iVar2 * iVar1);
  iVar2 = Gia_ManCiNum(p);
  p_00 = Vec_WrdStart(iVar2 * iVar1);
  iPat = 0;
  do {
    if (nCexes + nUnDecs <= iPat) {
      iVar1 = Vec_IntSize(vCexStore);
      if (nWordsMax != iVar1) {
        __assert_fail("iCur == Vec_IntSize(vCexStore)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0xf2,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)");
      }
      iVar1 = Gia_ManCiNum(p);
      pVVar5 = p->vSimsPi;
      iVar2 = Abc_Bit6WordNum(vSimsIn._4_4_ + 1);
      pVVar5 = Gia_ManSimCombine(iVar1,pVVar5,vAddOn,iVar2);
      uVar4 = Abc_Bit6WordNum(vSimsIn._4_4_ + 1);
      iVar1 = Vec_WrdSize(p->vSimsPi);
      iVar2 = Gia_ManCiNum(p);
      printf("Compressed %d CEXes into %d patterns and added %d words to available %d words.\n",
             (ulong)(uint)nCexes,(ulong)vSimsIn._4_4_,(ulong)uVar4,
             (long)iVar1 / (long)iVar2 & 0xffffffff);
      Vec_WrdFree(vAddOn);
      Vec_WrdFree(p_00);
      return pVVar5;
    }
    iVar2 = nWordsMax + 1;
    Vec_IntEntry(vCexStore,nWordsMax);
    nWordsMax = nWordsMax + 2;
    iVar2 = Vec_IntEntry(vCexStore,iVar2);
    if (iVar2 != -1) {
      pLits = Vec_IntEntryP(vCexStore,nWordsMax);
      iVar3 = Gia_ManSimBitPackOne(iVar1,vAddOn,p_00,vSimsIn._4_4_,pLits,iVar2);
      vSimsIn._4_4_ = iVar3 + vSimsIn._4_4_;
      nWordsMax = iVar2 + nWordsMax;
      if (nCexes + nUnDecs < (int)vSimsIn._4_4_) {
        __assert_fail("iPat <= nCexes + nUnDecs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0xef,"Vec_Wrd_t *Gia_ManSimBitPacking(Gia_Man_t *, Vec_Int_t *, int, int)");
      }
    }
    iPat = iPat + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManSimBitPacking( Gia_Man_t * p, Vec_Int_t * vCexStore, int nCexes, int nUnDecs )
{
    int c, iCur = 0, iPat = 0;
    int nWordsMax = Abc_Bit6WordNum( nCexes ); 
    Vec_Wrd_t * vSimsIn   = Vec_WrdStartRandom( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsCare = Vec_WrdStart( Gia_ManCiNum(p) * nWordsMax );
    Vec_Wrd_t * vSimsRes  = NULL;
    for ( c = 0; c < nCexes + nUnDecs; c++ )
    {
        int Out  = Vec_IntEntry( vCexStore, iCur++ );
        int Size = Vec_IntEntry( vCexStore, iCur++ );
        if ( Size == -1 )
            continue;
        iPat += Gia_ManSimBitPackOne( nWordsMax, vSimsIn, vSimsCare, iPat, Vec_IntEntryP(vCexStore, iCur), Size );
        iCur += Size;
        assert( iPat <= nCexes + nUnDecs );
        Out = 0;
    }
    assert( iCur == Vec_IntSize(vCexStore) );
    vSimsRes = Gia_ManSimCombine( Gia_ManCiNum(p), p->vSimsPi, vSimsIn, Abc_Bit6WordNum(iPat+1) );
    printf( "Compressed %d CEXes into %d patterns and added %d words to available %d words.\n", 
        nCexes, iPat, Abc_Bit6WordNum(iPat+1), Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p) );
    Vec_WrdFree( vSimsIn );
    Vec_WrdFree( vSimsCare );
    return vSimsRes;
}